

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

float64 cluster(int32 ts,uint32 n_stream,uint32 n_in_frame,uint32 *veclen,uint32 blksize,
               vector_t **mean,uint32 n_density,codew_t **out_label)

{
  uint32 uVar1;
  vector_t *ppfVar2;
  uint32 n_obs;
  int iVar3;
  cmd_ln_t *pcVar4;
  char *__s1;
  long lVar5;
  long lVar6;
  float32 fVar7;
  double dVar8;
  char *meth;
  uint32 n_frame;
  uint32 s;
  float64 sqerr;
  float64 sum_sqerr;
  vector_t **mean_local;
  uint32 blksize_local;
  uint32 *veclen_local;
  uint32 n_in_frame_local;
  uint32 n_stream_local;
  int32 ts_local;
  
  _n_frame = 0.0;
  *out_label = (codew_t *)0x0;
  k_means_set_get_obs(get_obs);
  meth._4_4_ = 0;
  sqerr = 0.0;
  do {
    if (n_stream <= meth._4_4_) {
      return sqerr;
    }
    pcVar4 = cmd_ln_get();
    __s1 = cmd_ln_str_r(pcVar4,"-method");
    n_obs = setup_obs(ts,meth._4_4_,n_in_frame,n_stream,veclen,blksize);
    iVar3 = strcmp(__s1,"rkm");
    if (iVar3 == 0) {
      pcVar4 = cmd_ln_get();
      lVar5 = cmd_ln_int_r(pcVar4,"-ntrial");
      uVar1 = veclen[meth._4_4_];
      ppfVar2 = mean[meth._4_4_];
      pcVar4 = cmd_ln_get();
      dVar8 = cmd_ln_float_r(pcVar4,"-minratio");
      pcVar4 = cmd_ln_get();
      lVar6 = cmd_ln_int_r(pcVar4,"-maxiter");
      fVar7 = random_kmeans((uint32)lVar5,n_obs,uVar1,ppfVar2,n_density,(float32)(float)dVar8,
                            (uint32)lVar6,out_label);
      _n_frame = (float64)(double)(float)fVar7;
      if ((double)_n_frame < 0.0) {
        err_msg(ERR_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/kmeans_init/main.c"
                ,0x349,"Too few observations for kmeans\n");
        return -1.0;
      }
    }
    else {
      iVar3 = strcmp(__s1,"fnkm");
      if (iVar3 == 0) {
        uVar1 = veclen[meth._4_4_];
        ppfVar2 = mean[meth._4_4_];
        pcVar4 = cmd_ln_get();
        dVar8 = cmd_ln_float_r(pcVar4,"-minratio");
        pcVar4 = cmd_ln_get();
        lVar5 = cmd_ln_int_r(pcVar4,"-maxiter");
        _n_frame = furthest_neighbor_kmeans
                             (n_obs,uVar1,ppfVar2,n_density,(float32)(float)dVar8,(uint32)lVar5);
      }
      else {
        err_msg(ERR_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/kmeans_init/main.c"
                ,0x357,"I don\'t know how to do method \'%s\'.  Sorry.\n",__s1);
      }
    }
    meth._4_4_ = meth._4_4_ + 1;
    sqerr = (float64)((double)_n_frame + (double)sqerr);
  } while( true );
}

Assistant:

float64
cluster(int32 ts,
	uint32 n_stream,
	uint32 n_in_frame,
	uint32 *veclen,
	uint32 blksize,
	vector_t **mean,
	uint32 n_density,
	codew_t **out_label)
{
    float64 sum_sqerr, sqerr=0;
    uint32 s, n_frame;
    const char *meth;
    
    *out_label = NULL;

    k_means_set_get_obs(&get_obs);

    for (s = 0, sum_sqerr = 0; s < n_stream; s++, sum_sqerr += sqerr) {
	meth = cmd_ln_str("-method");

	n_frame = setup_obs(ts, s, n_in_frame, n_stream, veclen, blksize);

	if (strcmp(meth, "rkm") == 0) {
	    sqerr = random_kmeans(cmd_ln_int32("-ntrial"),
				  n_frame,
				  veclen[s],
				  mean[s],
				  n_density,
				  cmd_ln_float32("-minratio"),
				  cmd_ln_int32("-maxiter"),
				  out_label);
	    if (sqerr < 0) {
		E_ERROR("Too few observations for kmeans\n");
		
		return -1.0;
	    }
	}
	else if (strcmp(meth, "fnkm") == 0) {
	    sqerr = furthest_neighbor_kmeans(n_frame,
					     veclen[s],
					     mean[s],
					     n_density,
					     cmd_ln_float32("-minratio"),
					     cmd_ln_int32("-maxiter"));
	}
	else {
	    E_ERROR("I don't know how to do method '%s'.  Sorry.\n", meth);
	}
    }

    return sum_sqerr;
}